

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_write_op(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp out)

{
  sexp psVar1;
  
  if ((((ulong)out & 3) == 0) && (out->tag == 0x11)) {
    sexp_maybe_block_output_port(ctx,out);
    sexp_write_one(ctx,obj,out,0);
    sexp_maybe_unblock_port(ctx,out);
    return (sexp)&DAT_0000043e;
  }
  psVar1 = sexp_type_exception(ctx,self,0x11,out);
  return psVar1;
}

Assistant:

sexp sexp_write_op (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp out) {
  sexp res;
  sexp_assert_type(ctx, sexp_oportp, SEXP_OPORT, out);
#if SEXP_USE_GREEN_THREADS
  sexp_maybe_block_output_port(ctx, out);
#endif
  res = sexp_write_one(ctx, obj, out, 0);
#if SEXP_USE_GREEN_THREADS
  sexp_maybe_unblock_port(ctx, out);
#endif
  return res;
}